

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::interval_t,double,duckdb::UnaryOperatorWrapper,duckdb::DatePart::EpochOperator>
               (interval_t *ldata,double *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int64_t extraout_RDX;
  idx_t iVar5;
  idx_t extraout_RDX_00;
  int64_t extraout_RDX_01;
  int64_t extraout_RDX_02;
  int64_t extraout_RDX_03;
  int64_t iVar6;
  idx_t iVar7;
  int64_t *piVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  double dVar12;
  interval_t input;
  interval_t input_00;
  interval_t input_01;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    piVar8 = &ldata->micros;
    iVar5 = count;
    for (iVar7 = 0; count != iVar7; iVar7 = iVar7 + 1) {
      input.micros = iVar5;
      input._0_8_ = *piVar8;
      dVar12 = DatePart::EpochOperator::Operation<duckdb::interval_t,double>
                         (*(EpochOperator **)(piVar8 + -1),input);
      result_data[iVar7] = dVar12;
      piVar8 = piVar8 + 2;
      iVar5 = extraout_RDX_00;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
      iVar6 = extraout_RDX;
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
      iVar6 = extraout_RDX_01;
    }
    puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    uVar11 = 0;
    for (uVar4 = 0; uVar4 != count + 0x3f >> 6; uVar4 = uVar4 + 1) {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar10 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar10 = count;
        }
LAB_01de9820:
        piVar8 = &ldata[uVar11].micros;
        for (; uVar3 = uVar11, uVar11 < uVar10; uVar11 = uVar11 + 1) {
          input_00.micros = iVar6;
          input_00._0_8_ = *piVar8;
          dVar12 = DatePart::EpochOperator::Operation<duckdb::interval_t,double>
                             (*(EpochOperator **)(piVar8 + -1),input_00);
          result_data[uVar11] = dVar12;
          piVar8 = piVar8 + 2;
          iVar6 = extraout_RDX_02;
        }
      }
      else {
        uVar2 = puVar1[uVar4];
        uVar10 = uVar11 + 0x40;
        if (count <= uVar11 + 0x40) {
          uVar10 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_01de9820;
        uVar3 = uVar10;
        if (uVar2 != 0) {
          piVar8 = &ldata[uVar11].micros;
          for (uVar9 = 0; uVar3 = uVar11 + uVar9, uVar11 + uVar9 < uVar10; uVar9 = uVar9 + 1) {
            if ((uVar2 >> (uVar9 & 0x3f) & 1) != 0) {
              input_01.micros = iVar6;
              input_01._0_8_ = *piVar8;
              dVar12 = DatePart::EpochOperator::Operation<duckdb::interval_t,double>
                                 (*(EpochOperator **)(piVar8 + -1),input_01);
              result_data[uVar11 + uVar9] = dVar12;
              iVar6 = extraout_RDX_03;
            }
            piVar8 = piVar8 + 2;
          }
        }
      }
      uVar11 = uVar3;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}